

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Add_DoubleHelper
              (Var addLeft,double dblRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var aRight_00;
  double dVar2;
  Var aRight;
  double sum_1;
  double sum;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  double dblRight_local;
  Var addLeft_local;
  
  bVar1 = TaggedInt::Is(addLeft);
  if (bVar1) {
    dVar2 = TaggedInt::ToDouble(addLeft);
    addLeft_local = JavascriptNumber::ToVarMaybeInPlace(dVar2 + dblRight,scriptContext,result);
  }
  else {
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(addLeft);
    if (bVar1) {
      dVar2 = JavascriptNumber::GetValue(addLeft);
      addLeft_local = JavascriptNumber::ToVarMaybeInPlace(dVar2 + dblRight,scriptContext,result);
    }
    else {
      aRight_00 = JavascriptNumber::ToVarMaybeInPlace(dblRight,scriptContext,result);
      addLeft_local = Add_Full(addLeft,aRight_00,scriptContext);
    }
  }
  return addLeft_local;
}

Assistant:

Var inline JavascriptMath::Add_DoubleHelper(Var addLeft, double dblRight, ScriptContext* scriptContext, JavascriptNumber*result)
        {
            if (TaggedInt::Is(addLeft))
            {
                double sum =  TaggedInt::ToDouble(addLeft) + dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(addLeft))
            {
                double sum = JavascriptNumber::GetValue(addLeft) + dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else
            {
                Var aRight = JavascriptNumber::ToVarMaybeInPlace(dblRight, scriptContext, result);

                return Add_Full(addLeft, aRight, scriptContext);
            }
        }